

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

bool SQClosure::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  SQSharedState *ss;
  SQObjectValue func_00;
  bool bVar1;
  SQInteger SVar2;
  SQWeakRef *root;
  SQClosure *x;
  char *pcVar3;
  SQObjectPtr func;
  SQObjectPtr local_40;
  int local_2c;
  
  SVar2 = (*read)(up,&local_40,4);
  if (SVar2 == 4) {
    if (local_40.super_SQObject._type == 0x53514952) {
      SVar2 = (*read)(up,&local_40,4);
      if (SVar2 != 4) goto LAB_001531f6;
      if (local_40.super_SQObject._type == 1) {
        SVar2 = (*read)(up,&local_40,4);
        if (SVar2 != 4) goto LAB_001531f6;
        if (local_40.super_SQObject._type == 8) {
          SVar2 = (*read)(up,&local_40,4);
          if (SVar2 != 4) goto LAB_001531f6;
          if (local_40.super_SQObject._type == 4) {
            local_40.super_SQObject._type = OT_NULL;
            local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
            bVar1 = SQFunctionProto::Load(v,up,read,&local_40);
            if (bVar1) {
              SVar2 = (*read)(up,&local_2c,4);
              func_00 = local_40.super_SQObject._unVal;
              if (SVar2 == 4) {
                if (local_2c == 0x5441494c) {
                  ss = v->_sharedstate;
                  root = SQRefCounted::GetWeakRef
                                   ((v->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
                  x = Create(ss,func_00.pFunctionProto,root);
                  bVar1 = true;
                  SQObjectPtr::operator=(ret,x);
                  goto LAB_0015323d;
                }
                pcVar3 = "invalid or corrupted closure stream";
              }
              else {
                pcVar3 = 
                "io error, read function failure, the origin stream could be corrupted/trucated";
              }
              SQVM::Raise_Error(v,pcVar3);
            }
            bVar1 = false;
LAB_0015323d:
            SQObjectPtr::~SQObjectPtr(&local_40);
            return bVar1;
          }
        }
      }
    }
    pcVar3 = "invalid or corrupted closure stream";
  }
  else {
LAB_001531f6:
    pcVar3 = "io error, read function failure, the origin stream could be corrupted/trucated";
  }
  SQVM::Raise_Error(v,pcVar3);
  return false;
}

Assistant:

bool SQClosure::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_HEAD));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQChar)));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQInteger)));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQFloat)));
    SQObjectPtr func;
    _CHECK_IO(SQFunctionProto::Load(v,up,read,func));
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_TAIL));
    ret = SQClosure::Create(_ss(v),_funcproto(func),_table(v->_roottable)->GetWeakRef(OT_TABLE));
    //FIXME: load an root for this closure
    return true;
}